

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O0

void __thiscall
duckdb::BaseAppender::AppendValueInternal<unsigned_char,unsigned_int>
          (BaseAppender *this,Vector *col,uchar input)

{
  uint uVar1;
  uint *puVar2;
  idx_t iVar3;
  long in_RDI;
  uchar unaff_retaddr;
  
  uVar1 = Cast::Operation<unsigned_char,unsigned_int>(unaff_retaddr);
  puVar2 = FlatVector::GetData<unsigned_int>((Vector *)0x941c36);
  iVar3 = DataChunk::size((DataChunk *)(in_RDI + 0x48));
  puVar2[iVar3] = uVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}